

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseMaxBoxSize(Vec_Ptr_t *vUndefs)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (0 < (long)vUndefs->nSize) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      lVar2 = *(long *)((long)vUndefs->pArray[lVar4] + 0x158);
      lVar5 = (long)*(int *)(lVar2 + 4);
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + lVar6 * 8) + 0x40) + 4);
          if (iVar3 <= iVar1) {
            iVar3 = iVar1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != vUndefs->nSize);
    return iVar3;
  }
  return 0;
}

Assistant:

int Ver_ParseMaxBoxSize( Vec_Ptr_t * vUndefs )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nMaxSize = 0;
    // go through undef box types
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
        // go through instances of this type
        Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
            // check the number of bundles of this instance
            if ( nMaxSize < Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
                nMaxSize = Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy);
    return nMaxSize;
}